

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void codeReal(Vdbe *v,char *z,int negateFlag,int iMem)

{
  int length;
  double local_28;
  double value;
  int iMem_local;
  int negateFlag_local;
  char *z_local;
  Vdbe *v_local;
  
  if (z != (char *)0x0) {
    value._0_4_ = iMem;
    value._4_4_ = negateFlag;
    _iMem_local = z;
    z_local = (char *)v;
    length = sqlite3Strlen30(z);
    sqlite3AtoF(z,&local_28,length,'\x01');
    if (value._4_4_ != 0) {
      local_28 = -local_28;
    }
    sqlite3VdbeAddOp4Dup8((Vdbe *)z_local,0x99,0,value._0_4_,0,(u8 *)&local_28,-0xc);
  }
  return;
}

Assistant:

static void codeReal(Vdbe *v, const char *z, int negateFlag, int iMem){
  if( ALWAYS(z!=0) ){
    double value;
    sqlite3AtoF(z, &value, sqlite3Strlen30(z), SQLITE_UTF8);
    assert( !sqlite3IsNaN(value) ); /* The new AtoF never returns NaN */
    if( negateFlag ) value = -value;
    sqlite3VdbeAddOp4Dup8(v, OP_Real, 0, iMem, 0, (u8*)&value, P4_REAL);
  }
}